

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

int Abc_NtkGetExorNum(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = (long)pNtk->vObjs->nSize;
  if (0 < lVar4) {
    lVar5 = 0;
    iVar3 = 0;
    do {
      pvVar2 = pNtk->vObjs->pArray[lVar5];
      if ((pvVar2 != (void *)0x0) && (uVar1 = *(uint *)((long)pvVar2 + 0x14), (uVar1 & 0xf) == 7)) {
        iVar3 = iVar3 + (uint)((uVar1 >> 8 & 1) != 0);
      }
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
    return iVar3;
  }
  return 0;
}

Assistant:

int Abc_NtkGetExorNum( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, Counter = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        Counter += pNode->fExor;
    return Counter;
}